

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choker.cpp
# Opt level: O3

int libtorrent::aux::anon_unknown_9::anti_leech_score(peer_connection *peer)

{
  _Atomic_word *p_Var1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar10;
  
  p_Var3 = (peer->super_peer_connection_hot_members).m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    peVar9 = (element_type *)0x0;
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    peVar9 = (peer->super_peer_connection_hot_members).m_torrent.
             super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
    }
    iVar4 = p_Var3->_M_use_count;
    do {
      if (iVar4 == 0) {
        peVar9 = (element_type *)0x0;
        this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_0019624f;
      }
      LOCK();
      iVar2 = p_Var3->_M_use_count;
      bVar10 = iVar4 == iVar2;
      if (bVar10) {
        p_Var3->_M_use_count = iVar4 + 1;
        iVar2 = iVar4;
      }
      iVar4 = iVar2;
      UNLOCK();
    } while (!bVar10);
    this = p_Var3;
    if (p_Var3->_M_use_count == 0) {
      peVar9 = (element_type *)0x0;
    }
LAB_0019624f:
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
    }
  }
  lVar6 = (((peVar9->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_total_size;
  lVar5 = 0;
  if (lVar6 != 0) {
    iVar4 = (*(peer->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])(peer);
    lVar7 = lVar6 / 2;
    lVar5 = *(long *)CONCAT44(extraout_var,iVar4);
    if (lVar7 < *(long *)CONCAT44(extraout_var,iVar4)) {
      lVar5 = lVar7;
    }
    lVar8 = (long)peer->m_num_pieces *
            (long)(((peVar9->super_torrent_hot_members).m_torrent_file.
                    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->m_files).m_piece_length;
    if (lVar8 < lVar5) {
      lVar8 = lVar5;
    }
    lVar6 = ((lVar8 - lVar7) * 2000) / lVar6;
    lVar5 = -lVar6;
    if (0 < lVar6) {
      lVar5 = lVar6;
    }
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return (int)lVar5;
}

Assistant:

int anti_leech_score(peer_connection const* peer)
	{
		// the anti-leech seeding algorithm is based on the paper "Improving
		// BitTorrent: A Simple Approach" from Chow et. al. and ranks peers based
		// on how many pieces they have, preferring to unchoke peers that just
		// started and peers that are close to completing. Like this:
		//   ^
		//   | \                       / |
		//   |  \                     /  |
		//   |   \                   /   |
		// s |    \                 /    |
		// c |     \               /     |
		// o |      \             /      |
		// r |       \           /       |
		// e |        \         /        |
		//   |         \       /         |
		//   |          \     /          |
		//   |           \   /           |
		//   |            \ /            |
		//   |             V             |
		//   +---------------------------+
		//   0%    num have pieces     100%
		std::shared_ptr<torrent> const t = peer->associated_torrent().lock();
		TORRENT_ASSERT(t);

		std::int64_t const total_size = t->torrent_file().total_size();
		if (total_size == 0) return 0;
		// Cap the given_size so that it never causes the score to increase
		std::int64_t const given_size = std::min(peer->statistics().total_payload_upload()
			, total_size / 2);
		std::int64_t const have_size = std::max(given_size
			, std::int64_t(t->torrent_file().piece_length()) * peer->num_have_pieces());
		return int(std::abs((have_size - total_size / 2) * 2000 / total_size));
	}